

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O3

bool __thiscall
pg::PTLSolver::search_rec(PTLSolver *this,bitset *Region,int vtop,int player,bitset *Subgame)

{
  size_t __n;
  int iVar1;
  uint uVar2;
  Game *pGVar3;
  pointer pcVar4;
  char cVar5;
  undefined8 uVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  string **ppsVar12;
  uint64_t *puVar13;
  ostream *poVar14;
  size_t sVar15;
  long lVar16;
  long *plVar17;
  ulong uVar18;
  uint vtop_00;
  byte bVar19;
  uint uVar20;
  int *piVar21;
  uint uVar22;
  uint64_t *puVar23;
  uint *puVar24;
  ulong uVar25;
  uint uVar26;
  bitset *this_00;
  long lVar27;
  string px;
  string __str;
  _label_vertex local_130;
  undefined1 local_120 [64];
  int *local_e0;
  uint64_t *puStack_d8;
  int *local_d0;
  string *local_c8;
  vector<int,_std::allocator<int>_> **local_c0 [2];
  vector<int,_std::allocator<int>_> *local_b0 [2];
  size_t local_a0;
  bitset local_98;
  ulong local_78;
  ulong local_70;
  bitset local_68;
  int *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar25 = Region->_bitssize;
  local_98._size = Region->_size;
  local_98._bitssize = Region->_bitssize;
  piVar21 = (int *)(uVar25 * 8);
  local_98._allocsize = (size_t)piVar21;
  local_120._16_8_ = operator_new__(-(ulong)(uVar25 >> 0x3d != 0) | (ulong)piVar21);
  local_98._bits = (uint64_t *)local_120._16_8_;
  if (uVar25 != 0) {
    memmove((void *)local_120._16_8_,Region->_bits,(size_t)piVar21);
  }
  local_e0 = (int *)((this->super_Solver).game)->n_vertices;
  uVar25 = (long)local_e0 + 0x3f;
  puStack_d8 = (uint64_t *)(uVar25 >> 6);
  piVar21 = (int *)((long)puStack_d8 << 3);
  local_d0 = piVar21;
  ppsVar12 = (string **)operator_new__((ulong)piVar21);
  local_120._56_8_ = ppsVar12;
  if (0x3f < uVar25) {
    memset(ppsVar12,0,(size_t)piVar21);
  }
  local_68._size = Subgame->_size;
  local_68._bitssize = Subgame->_bitssize;
  uVar25 = Subgame->_bitssize;
  __n = uVar25 * 8;
  uVar18 = 0xffffffffffffffff;
  if (uVar25 < 0x2000000000000000) {
    uVar18 = __n;
  }
  local_68._allocsize = __n;
  puVar13 = (uint64_t *)operator_new__(uVar18);
  local_68._bits = puVar13;
  if (uVar25 != 0) {
    memmove(puVar13,Subgame->_bits,__n);
  }
  uVar25 = (ulong)vtop;
  local_78 = uVar25 >> 6;
  bVar19 = (byte)vtop & 0x3f;
  local_38 = -2L << bVar19 | 0xfffffffffffffffeU >> 0x40 - bVar19;
  *(string **)(local_120._16_8_ + local_78 * 8) =
       (string *)((ulong)*(string **)(local_120._16_8_ + local_78 * 8) & local_38);
  if (vtop == 0) {
    bVar19 = 0;
  }
  else {
    local_c8 = (string *)&this->path;
    local_a0 = 0;
    local_48 = (int *)(1L << (uVar25 & 0x3f));
    local_40 = uVar25;
    do {
      this_00 = (bitset *)(local_120 + 0x38);
      uVar25 = uVar25 - 1;
      uVar18 = uVar25 >> 6;
      if (((ulong)local_98._bits[uVar18] >> (uVar25 & 0x3f) & 1) != 0) {
        local_70 = 1L << (uVar25 & 0x3f);
        uVar22 = ((this->super_Solver).game)->_priority[uVar25];
        local_120._16_8_ = ZEXT48(uVar22);
        vtop_00 = (uint)uVar25;
        if ((uVar22 & 1) == player) {
          *(string **)(local_120._56_8_ + uVar18 * 8) =
               (string *)((ulong)*(string **)(local_120._56_8_ + uVar18 * 8) | local_70);
          this->str[uVar25] = -1;
          iVar1 = (this->Q).pointer;
          (this->Q).pointer = iVar1 + 1;
          (this->Q).queue[iVar1] = vtop_00;
          while( true ) {
            iVar1 = (this->Q).pointer;
            if ((long)iVar1 == 0) break;
            (this->Q).pointer = iVar1 + -1;
            uVar2 = (this->Q).queue[(long)iVar1 + -1];
            attractVertices(this,player,uVar2,&local_98,this_00,&local_68);
            attractTangles(this,player,uVar2,&local_98,this_00,&local_68);
          }
          if (1 < (this->super_Solver).trace) {
            poVar14 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,"\x1b[1;33mregion\x1b[m \x1b[1;36m",0x18);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(this->path)._M_dataplus._M_p,(this->path)._M_string_length
                                );
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"-",1);
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,(int)local_120._16_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\x1b[m",3);
            for (sVar15 = bitset::find_first(this_00); sVar15 != 0xffffffffffffffff;
                sVar15 = bitset::find_next(this_00,sVar15)) {
              poVar14 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar14," \x1b[1;38;5;15m",0xd);
              local_130.g = (this->super_Solver).game;
              local_130.v = (int)sVar15;
              poVar14 = operator<<(poVar14,&local_130);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\x1b[m",3);
              if (this->str[sVar15] != -1) {
                poVar14 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"->",2);
                local_130.g = (this->super_Solver).game;
                local_130.v = this->str[sVar15];
                operator<<(poVar14,&local_130);
              }
            }
            poVar14 = (this->super_Solver).logger;
            cVar5 = (char)poVar14;
            std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
          }
          pGVar3 = (this->super_Solver).game;
          if ((uint)(((pGVar3->_owner)._bits[uVar18] & local_70) != 0) == player) {
            if (this->str[uVar25] != -1) goto LAB_00179df0;
LAB_00179d01:
            local_130.g = (Game *)local_120;
            pcVar4 = (this->path)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_130,pcVar4,pcVar4 + (this->path)._M_string_length);
            uVar20 = 1;
            uVar26 = (uint)local_120._16_8_;
            uVar22 = -uVar26;
            if (0 < (int)uVar26) {
              uVar22 = uVar26;
            }
            if (9 < uVar22) {
              uVar18 = (ulong)uVar22;
              uVar26 = 4;
              do {
                uVar20 = uVar26;
                uVar10 = (uint)uVar18;
                if (uVar10 < 100) {
                  uVar20 = uVar20 - 2;
                  goto LAB_0017a1b5;
                }
                if (uVar10 < 1000) {
                  uVar20 = uVar20 - 1;
                  goto LAB_0017a1b5;
                }
                if (uVar10 < 10000) goto LAB_0017a1b5;
                uVar18 = uVar18 / 10000;
                uVar26 = uVar20 + 4;
              } while (99999 < uVar10);
              uVar20 = uVar20 + 1;
            }
LAB_0017a1b5:
            local_c0[0] = local_b0;
            uVar18 = (ulong)local_120._16_8_ >> 0x1f & 1;
            std::__cxx11::string::_M_construct((ulong)local_c0,(char)uVar20 + (char)uVar18);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)(uVar18 + (long)local_c0[0]),uVar20,uVar22);
            plVar17 = (long *)std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0x185b96);
            local_120._24_8_ = local_120 + 0x28;
            puVar13 = (uint64_t *)(plVar17 + 2);
            if ((uint64_t *)*plVar17 == puVar13) {
              local_120._40_8_ = *puVar13;
              local_120._48_8_ = plVar17[3];
            }
            else {
              local_120._40_8_ = *puVar13;
              local_120._24_8_ = (uint64_t *)*plVar17;
            }
            local_120._32_8_ = plVar17[1];
            *plVar17 = (long)puVar13;
            plVar17[1] = 0;
            *(undefined1 *)(plVar17 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_c8,local_120._24_8_);
            if ((undefined1 *)local_120._24_8_ != local_120 + 0x28) {
              operator_delete((void *)local_120._24_8_,local_120._40_8_ + 1);
            }
            if (local_c0[0] != local_b0) {
              operator_delete(local_c0[0],
                              (ulong)((long)&(local_b0[0]->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_start + 1));
            }
            bVar9 = search_rec(this,this_00,vtop_00,player,&local_68);
            std::__cxx11::string::_M_assign(local_c8);
            if (local_130.g != (Game *)local_120) {
              operator_delete(local_130.g,local_120._0_8_ + 1);
            }
          }
          else {
            uVar22 = pGVar3->_outedges[pGVar3->_firstouts[uVar25]];
            if (uVar22 != 0xffffffff) {
              puVar24 = (uint *)(pGVar3->_outedges + (long)pGVar3->_firstouts[uVar25] + 1);
              do {
                if ((((ulong)*(string **)(local_120._56_8_ + ((ulong)(long)(int)uVar22 >> 6) * 8) >>
                      ((ulong)uVar22 & 0x3f) & 1) == 0) &&
                   ((local_68._bits[(ulong)(long)(int)uVar22 >> 6] & 1L << ((ulong)uVar22 & 0x3f))
                    != 0)) goto LAB_00179d01;
                uVar22 = *puVar24;
                puVar24 = puVar24 + 1;
              } while (uVar22 != 0xffffffff);
            }
LAB_00179df0:
            memset(this->pea_vidx,0,pGVar3->n_vertices << 2);
            this->pea_curidx = 1;
            bVar9 = extractTangles(this,vtop_00,this_00,this->str);
          }
          if ((uint64_t *)local_98._bitssize != (uint64_t *)0x0) {
            puVar13 = (uint64_t *)0x0;
            do {
              local_98._bits[(long)puVar13] =
                   (uint64_t)
                   ((ulong)local_98._bits[(long)puVar13] &
                   ~(ulong)*(string **)(local_120._56_8_ + puVar13 * 8));
              puVar13 = (uint64_t *)((long)puVar13 + 1);
            } while ((uint64_t *)local_98._bitssize != puVar13);
          }
          if (local_68._bitssize != 0) {
            sVar15 = 0;
            do {
              local_68._bits[sVar15] =
                   local_68._bits[sVar15] & ~(ulong)*(string **)(local_120._56_8_ + sVar15 * 8);
              sVar15 = sVar15 + 1;
            } while (local_68._bitssize != sVar15);
          }
        }
        else {
          local_98._bits[uVar18] = (uint64_t)(~local_70 & (ulong)local_98._bits[uVar18]);
          ppsVar12[local_78] = (string *)((ulong)ppsVar12[local_78] | (ulong)local_48);
          this->str[local_40] = -1;
          iVar1 = (this->Q).pointer;
          (this->Q).pointer = iVar1 + 1;
          (this->Q).queue[iVar1] = (uint)local_40;
          while( true ) {
            sVar8 = local_98._allocsize;
            sVar7 = local_98._bitssize;
            sVar15 = local_98._size;
            puVar13 = local_98._bits;
            uVar6 = local_120._56_8_;
            iVar1 = (this->Q).pointer;
            if ((long)iVar1 == 0) break;
            (this->Q).pointer = iVar1 + -1;
            uVar2 = (this->Q).queue[(long)iVar1 + -1];
            attractVertices(this,player,uVar2,&local_98,this_00,&local_68);
            attractTangles(this,player,uVar2,&local_98,this_00,&local_68);
          }
          local_98._size = (size_t)local_e0;
          local_98._bitssize = (size_t)puStack_d8;
          local_e0 = (int *)sVar15;
          puStack_d8 = (uint64_t *)sVar7;
          local_98._allocsize = (size_t)local_d0;
          local_d0 = (int *)sVar8;
          local_98._bits = (uint64_t *)local_120._56_8_;
          local_120._56_8_ = puVar13;
          ppsVar12 = (string **)(uVar6 + local_78 * 8);
          *ppsVar12 = (string *)((ulong)*ppsVar12 & local_38);
          if ((uint64_t *)sVar7 != (uint64_t *)0x0) {
            puVar23 = (uint64_t *)0x0;
            do {
              puVar13[(long)puVar23] =
                   (uint64_t)
                   ((ulong)puVar13[(long)puVar23] & ~(ulong)*(string **)(uVar6 + puVar23 * 8));
              puVar23 = (uint64_t *)((long)puVar23 + 1);
            } while ((uint64_t *)sVar7 != puVar23);
          }
          puVar13[uVar18] = (uint64_t)((ulong)puVar13[uVar18] | local_70);
          if (1 < (this->super_Solver).trace) {
            poVar14 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,"\x1b[1;33mregion\x1b[m \x1b[1;36m",0x18);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(this->path)._M_dataplus._M_p,(this->path)._M_string_length
                                );
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"-",1);
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,(int)local_120._16_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\x1b[m",3);
            if (puStack_d8 != (uint64_t *)0x0) {
              lVar16 = (long)puStack_d8 * -0x40;
              puVar13 = puStack_d8;
              do {
                lVar16 = lVar16 + 0x40;
                if (*(string **)(local_120._56_8_ + ((long)puVar13 - 1) * 8) != (string *)0x0) {
                  lVar27 = LZCOUNT(*(string **)(local_120._56_8_ + ((long)puVar13 - 1) * 8));
                  if (lVar16 - lVar27 != 0x40) {
                    sVar15 = lVar27 - lVar16 ^ 0x3f;
                    do {
                      poVar14 = (this->super_Solver).logger;
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14," \x1b[1;38;5;15m",0xd);
                      local_130.g = (this->super_Solver).game;
                      local_130.v = (int)sVar15;
                      poVar14 = operator<<(poVar14,&local_130);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\x1b[m",3);
                      uVar18 = (ulong)this->str[sVar15];
                      if ((uVar18 != 0xffffffffffffffff) &&
                         (((ulong)*(string **)(local_120._56_8_ + (uVar18 >> 6) * 8) >>
                           (uVar18 & 0x3f) & 1) != 0)) {
                        poVar14 = (this->super_Solver).logger;
                        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"->",2);
                        local_130.g = (this->super_Solver).game;
                        local_130.v = this->str[sVar15];
                        operator<<(poVar14,&local_130);
                      }
                      sVar15 = bitset::find_prev(this_00,sVar15);
                    } while (sVar15 != 0xffffffffffffffff);
                  }
                  break;
                }
                puVar13 = (uint64_t *)((long)puVar13 - 1);
              } while (puVar13 != (uint64_t *)0x0);
            }
            poVar14 = (this->super_Solver).logger;
            cVar5 = (char)poVar14;
            std::ios::widen((char)poVar14->_vptr_basic_ostream[-3] + cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
          }
          local_130.g = (Game *)local_120;
          pcVar4 = (this->path)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,pcVar4,pcVar4 + (this->path)._M_string_length);
          uVar20 = 1;
          uVar26 = (uint)local_120._16_8_;
          uVar22 = -uVar26;
          if (0 < (int)uVar26) {
            uVar22 = uVar26;
          }
          if (9 < uVar22) {
            uVar18 = (ulong)uVar22;
            uVar10 = 4;
            do {
              uVar20 = uVar10;
              uVar11 = (uint)uVar18;
              if (uVar11 < 100) {
                uVar20 = uVar20 - 2;
                goto LAB_0017a024;
              }
              if (uVar11 < 1000) {
                uVar20 = uVar20 - 1;
                goto LAB_0017a024;
              }
              if (uVar11 < 10000) goto LAB_0017a024;
              uVar18 = uVar18 / 10000;
              uVar10 = uVar20 + 4;
            } while (99999 < uVar11);
            uVar20 = uVar20 + 1;
          }
LAB_0017a024:
          local_c0[0] = local_b0;
          std::__cxx11::string::_M_construct
                    ((ulong)local_c0,(char)uVar20 - (SUB81(local_120._16_8_,3) >> 7));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar26 >> 0x1f) + (long)local_c0[0]),uVar20,uVar22);
          plVar17 = (long *)std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0x185b96);
          local_120._24_8_ = local_120 + 0x28;
          puVar13 = (uint64_t *)(plVar17 + 2);
          if ((uint64_t *)*plVar17 == puVar13) {
            local_120._40_8_ = *puVar13;
            local_120._48_8_ = plVar17[3];
          }
          else {
            local_120._40_8_ = *puVar13;
            local_120._24_8_ = (uint64_t *)*plVar17;
          }
          local_120._32_8_ = plVar17[1];
          *plVar17 = (long)puVar13;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_c8,local_120._24_8_);
          if ((undefined1 *)local_120._24_8_ != local_120 + 0x28) {
            operator_delete((void *)local_120._24_8_,local_120._40_8_ + 1);
          }
          if (local_c0[0] != local_b0) {
            operator_delete(local_c0[0],
                            (ulong)((long)&(local_b0[0]->
                                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                           super__Vector_impl_data._M_start + 1));
          }
          bVar9 = search_rec(this,(bitset *)(local_120 + 0x38),vtop_00,player,&local_68);
          std::__cxx11::string::_M_assign(local_c8);
          if (local_130.g != (Game *)local_120) {
            operator_delete(local_130.g,local_120._0_8_ + 1);
          }
        }
        ppsVar12 = (string **)local_120._56_8_;
        local_a0 = CONCAT71((int7)(local_a0 >> 8),(byte)local_a0 | bVar9);
        if (puStack_d8 != (uint64_t *)0x0) {
          memset((void *)local_120._56_8_,0,(long)puStack_d8 << 3);
        }
      }
    } while (uVar25 != 0);
    bVar19 = (byte)local_a0;
    puVar13 = local_68._bits;
    if (local_68._bits == (uint64_t *)0x0) goto LAB_0017a326;
  }
  operator_delete__(puVar13);
LAB_0017a326:
  if ((string **)local_120._56_8_ != (string **)0x0) {
    operator_delete__((void *)local_120._56_8_);
  }
  if ((string **)local_98._bits != (string **)0x0) {
    operator_delete__(local_98._bits);
  }
  return (bool)(bVar19 & 1);
}

Assistant:

bool
PTLSolver::search_rec(bitset &Region, int vtop, int player, bitset &Subgame)
{
    bool changes = false; // whether we found tangles/dominions

    bitset Y(Region); // the remaining subgame of <R>
    bitset Z(nodecount()); // move me
    bitset Lower(Subgame);

#if 0 /**/
    // First, attract to the open "exit" for the opponent
    // That is, remove Attr(top) from <Y>.

    Z[vtop] = true; // add to <Z>
    str[vtop] = -1;
    Q.push(vtop);

    while (Q.nonempty()) {
        const int v = Q.pop();
        attractVertices(1-player, v, Y, Z, Y);
        if (multiplayer) attractTangles(1-player, v, Y, Z, Y);
    }

    Y -= Z;
    Z.reset();
#else
    Y[vtop] = false; // ensure <vtop> is never attracted...
    // Lower[vtop] = false; // and that 
#endif

    /////////////////
    // After each iteration:
    // <Y> and <Lower> are updated, removing subregions
    // if top is "good": attract to Z, remove from <Y> and <Lower>
    // if <Z> is a "bad" ... ..
    /////////////////

    for (int top=vtop-1; top!=-1; top--) {
        // find next top below <vtop> in Y
        if (!Y[top]) continue;

        /*
        logger << "Contents of Y:";
        for (auto v = Y.find_first(); v != bitset::npos; v = Y.find_next(v)) logger << " " << label_vertex(v);
        logger << std::endl;
        logger << "Contents of Lower:";
        for (auto v = Lower.find_first(); v != bitset::npos; v = Lower.find_next(v)) logger << " " << label_vertex(v);
        logger << std::endl;
        */

        const int pr = priority(top);
        const int pl = priority(top)&1;

        if (pl == player) {
            Z[top] = true; // add to <Z>
            str[top] = -1;
            Q.push(top);

            while (Q.nonempty()) {
                const int v = Q.pop();
                attractVertices(player, v, Y, Z, Lower);
                attractTangles(player, v, Y, Z, Lower);
            }

#ifndef NDEBUG
            if (trace >= 2) {
                // report region
                logger << "\033[1;33mregion\033[m \033[1;36m" << path << "-" << pr << "\033[m";
                for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) {
                    logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                }
                logger << std::endl;
            }
#endif

            /**
             * Now Z is the lowest region, <top> the top vertex
             */

            bool closed_region = true;

            /**
             * Lowest region, check if closed.
             */

            if (owner(top) == player) {
                if (str[top] == -1) closed_region = false;
            } else {
                for (auto curedge = outs(top); *curedge != -1; curedge++) {
                    if (!Z[*curedge] and Lower[*curedge]) {
                        closed_region = false;
                        break;
                    }
                }
            }

            if (closed_region) {
                /**
                 * Extract tangles by computing SCCs starting at each top vertex.
                 * Note: each bottom SCC must contain a head vertex.
                 */

                memset(pea_vidx, 0, sizeof(int[nodecount()]));
                pea_curidx = 1;
                changes |= extractTangles(top, Z, str);
            } else {
                /**
                 * Not a closed region, go recursive.
                 */

                std::string px = path;
                path += "-" + std::to_string(pr);
                changes |= search_rec(Z, top, player, Lower);
                path = px;
            }

            Y -= Z;
            Lower -= Z;
        } else {
            // Now recompute the region: reattract to <vtop>,
            // but not via higher (already removed) regions or via the bad vertex <top>

            // Y := remaining region except <top>
            // Lower := remaining region plus remaining lower game

            Y[top] = false; // remove <top> from consideration

            // logger << "Contents of Y2:";
            // for (auto v = Y2.find_first(); v != bitset::npos; v = Y2.find_next(v)) logger << " " << label_vertex(v);
            // logger << std::endl;

            Z[vtop] = true; // add to <Z>
            str[vtop] = -1;
            Q.push(vtop);

            while (Q.nonempty()) {
                const int v = Q.pop();
                attractVertices(player, v, Y, Z, Lower);
                attractTangles(player, v, Y, Z, Lower);
            }

            // Now Z is everything that can go to <vtop> avoiding <top>
            // And Y\Z is everything that must go via <top>

            // Set Y := everything to <vtop> not via <top>
            // Set Z := everything only to <vtop> via <top>

            Y.swap(Z);
            Y[vtop] = false; // but remove <vtop> again
            Z -= Y;
            Z[top] = true;

#ifndef NDEBUG
            if (trace >= 2) {
                // report region
                logger << "\033[1;33mregion\033[m \033[1;36m" << path << "-" << pr << "\033[m";
                for (auto v = Z.find_last(); v != bitset::npos; v = Z.find_prev(v)) {
                    logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1 and Z[str[v]]) logger << "->" << label_vertex(str[v]);
                }
                logger << std::endl;
            }
#endif

            std::string px = path;
            path += "-" + std::to_string(pr);
            changes |= search_rec(Z, top, player, Lower);
            path = px;
        }

        Z.reset();
    }

    return changes;
}